

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O1

CONCRETE_IO_HANDLE tlsio_openssl_create(void *io_create_parameters)

{
  int iVar1;
  undefined8 *__ptr;
  LOGGER_LOG p_Var2;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE pXVar3;
  char *pcVar4;
  undefined8 *xio_create_parameters;
  SOCKETIO_CONFIG socketio_config;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  
  if (io_create_parameters == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "NULL tls_io_config.";
      iVar1 = 0x504;
      goto LAB_0010aa7e;
    }
  }
  else {
    __ptr = (undefined8 *)malloc(0xd0);
    if (__ptr == (undefined8 *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed allocating TLSIO instance.";
        iVar1 = 0x50b;
        goto LAB_0010aa7e;
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s((char **)(__ptr + 0x15),*io_create_parameters);
      if (iVar1 == 0) {
        io_interface_description = *(IO_INTERFACE_DESCRIPTION **)((long)io_create_parameters + 0x10)
        ;
        if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
          local_30 = *io_create_parameters;
          xio_create_parameters = &local_30;
          local_28 = *(undefined4 *)((long)io_create_parameters + 8);
          local_20 = 0;
          io_interface_description = socketio_get_interface_description();
        }
        else {
          xio_create_parameters = *(undefined8 **)((long)io_create_parameters + 0x18);
        }
        if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
          free((void *)__ptr[0x15]);
          free(__ptr);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = "Failed getting socket IO interface description.";
            iVar1 = 0x52d;
            goto LAB_0010aa7e;
          }
        }
        else {
          *(undefined1 *)(__ptr + 0x17) = 0;
          __ptr[0x16] = 0;
          __ptr[0x18] = 0;
          *(undefined4 *)(__ptr + 0x19) = 0;
          __ptr[1] = 0;
          __ptr[2] = 0;
          __ptr[3] = 0;
          __ptr[4] = 0;
          __ptr[5] = 0;
          __ptr[6] = 0;
          __ptr[7] = 0;
          __ptr[8] = 0;
          __ptr[9] = 0;
          __ptr[10] = 0;
          __ptr[0xb] = 0;
          __ptr[0xc] = 0;
          __ptr[0xe] = 0;
          __ptr[0xf] = 0;
          __ptr[0x10] = 0;
          __ptr[0x11] = 0;
          __ptr[0x13] = 0;
          __ptr[0x14] = 0;
          *(undefined4 *)(__ptr + 0x12) = 0xc;
          pXVar3 = xio_create(io_interface_description,xio_create_parameters);
          *__ptr = pXVar3;
          if (pXVar3 != (XIO_HANDLE)0x0) {
            *(undefined4 *)(__ptr + 0xd) = 0;
            return __ptr;
          }
          free((void *)__ptr[0x15]);
          free(__ptr);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = "Failed xio_create.";
            iVar1 = 0x550;
LAB_0010aa7e:
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                      ,"tlsio_openssl_create",iVar1,1,pcVar4);
            return (CONCRETE_IO_HANDLE)0x0;
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_create",0x50f,1,"Failed copying the target hostname.");
        }
        free(__ptr);
      }
    }
  }
  return (CONCRETE_IO_HANDLE)0x0;
}

Assistant:

CONCRETE_IO_HANDLE tlsio_openssl_create(void* io_create_parameters)
{
    TLSIO_CONFIG* tls_io_config = io_create_parameters;
    TLS_IO_INSTANCE* result;

    if (tls_io_config == NULL)
    {
        result = NULL;
        LogError("NULL tls_io_config.");
    }
    else
    {
        result = malloc(sizeof(TLS_IO_INSTANCE));
        if (result == NULL)
        {
            LogError("Failed allocating TLSIO instance.");
        }
        else if (mallocAndStrcpy_s(&result->hostname, tls_io_config->hostname) != 0)
        {
            LogError("Failed copying the target hostname.");
            free(result);
            result = NULL;
        }
        else
        {
            SOCKETIO_CONFIG socketio_config;
            const IO_INTERFACE_DESCRIPTION* underlying_io_interface;
            void* io_interface_parameters;

            if (tls_io_config->underlying_io_interface != NULL)
            {
                underlying_io_interface = tls_io_config->underlying_io_interface;
                io_interface_parameters = tls_io_config->underlying_io_parameters;
            }
            else
            {
                socketio_config.hostname = tls_io_config->hostname;
                socketio_config.port = tls_io_config->port;
                socketio_config.accepted_socket = NULL;

                underlying_io_interface = socketio_get_interface_description();
                io_interface_parameters = &socketio_config;
            }

            if (underlying_io_interface == NULL)
            {
                free(result->hostname);
                free(result);
                result = NULL;
                LogError("Failed getting socket IO interface description.");
            }
            else
            {
                result->certificate = NULL;
                result->cipher_list = NULL;
                result->in_bio = NULL;
                result->out_bio = NULL;
                result->on_bytes_received = NULL;
                result->on_bytes_received_context = NULL;
                result->on_io_open_complete = NULL;
                result->on_io_open_complete_context = NULL;
                result->on_io_close_complete = NULL;
                result->on_io_close_complete_context = NULL;
                result->on_io_error = NULL;
                result->on_io_error_context = NULL;
                result->ssl = NULL;
                result->ssl_context = NULL;
                result->tls_validation_callback = NULL;
                result->tls_validation_callback_data = NULL;
                result->x509_certificate = NULL;
                result->x509_private_key = NULL;
                result->ignore_host_name_check = false;
                result->engine_id = NULL;
                result->engine = NULL;
                result->x509_private_key_type = KEY_TYPE_DEFAULT;

                result->tls_version = VERSION_1_2;

                result->underlying_io = xio_create(underlying_io_interface, io_interface_parameters);
                if (result->underlying_io == NULL)
                {
                    free(result->hostname);
                    free(result);
                    result = NULL;
                    LogError("Failed xio_create.");
                }
                else
                {
                    result->tlsio_state = TLSIO_STATE_NOT_OPEN;
                }
            }
        }
    }

    return result;
}